

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O3

int arkStep_FullRHS(void *arkode_mem,realtype t,N_Vector y,N_Vector f,int mode)

{
  realtype *c;
  bool bVar1;
  int iVar2;
  N_Vector *pp_Var3;
  int iVar4;
  N_Vector y_00;
  N_Vector p_Var5;
  char *msgfmt;
  ARKodeMem ark_mem_00;
  int nvec;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int local_54;
  ARKodeMem local_50;
  N_Vector *local_48;
  realtype *local_40;
  ARKodeARKStepMem local_38;
  
  iVar2 = arkStep_AccessStepMem(arkode_mem,"arkStep_FullRHS",&local_50,&local_38);
  if (iVar2 != 0) {
    return iVar2;
  }
  c = local_38->cvals;
  local_48 = local_38->Xvecs;
  if (((local_38->mass_type == 2) && (local_38->msetup != (ARKMassSetupFn)0x0)) &&
     (iVar2 = (*local_38->msetup)(local_50,t,f,local_50->tempv2,local_50->tempv3), iVar2 != 0)) {
    return -0xf;
  }
  ark_mem_00 = local_50;
  if (mode == 2) {
    if (local_38->explicit != 0) {
      iVar2 = (*local_38->fe)(t,y,local_50->tempv2,local_50->user_data);
      pp_Var3 = local_48;
      local_38->nfe = local_38->nfe + 1;
      if (iVar2 != 0) goto LAB_004c140a;
      if (local_38->expforcing != 0) {
        *c = 1.0;
        *local_48 = ark_mem_00->tempv2;
        local_54 = 1;
        local_40 = c;
        arkStep_ApplyForcing(local_38,t,1.0,&local_54);
        N_VLinearCombination(local_54,local_40,pp_Var3,ark_mem_00->tempv2);
      }
    }
    ark_mem_00 = local_50;
    if (local_38->implicit != 0) {
      iVar2 = (*local_38->fi)(t,y,local_38->sdata,local_50->user_data);
      pp_Var3 = local_48;
      local_38->nfi = local_38->nfi + 1;
      if (iVar2 != 0) goto LAB_004c140a;
      if (local_38->impforcing != 0) {
        *c = 1.0;
        *local_48 = local_38->sdata;
        local_54 = 1;
        arkStep_ApplyForcing(local_38,t,1.0,&local_54);
        N_VLinearCombination(local_54,c,pp_Var3,local_38->sdata);
      }
    }
    if (local_38->explicit == 0) {
      if (local_38->implicit == 0) goto LAB_004c15be;
      p_Var5 = local_38->sdata;
    }
    else {
      if (local_38->implicit != 0) {
        p_Var5 = local_38->sdata;
        y_00 = local_50->tempv2;
        goto LAB_004c150b;
      }
LAB_004c15be:
      p_Var5 = local_50->tempv2;
    }
LAB_004c1532:
    N_VScale(1.0,p_Var5,f);
  }
  else {
    if (mode == 1) {
      iVar2 = local_38->explicit;
      if ((iVar2 != 0) && (1e-10 < ABS(local_38->Be->c[(long)local_38->stages + -1] + -1.0))) {
        iVar4 = local_38->implicit;
        if (iVar4 != 0) {
          bVar1 = false;
          goto LAB_004c130b;
        }
LAB_004c1347:
        iVar2 = (*local_38->fe)(t,y,*local_38->Fe,local_50->user_data);
        pp_Var3 = local_48;
        local_38->nfe = local_38->nfe + 1;
        if (iVar2 != 0) goto LAB_004c140a;
        if (local_38->expforcing != 0) {
          *c = 1.0;
          *local_48 = *local_38->Fe;
          local_54 = 1;
          local_40 = c;
          arkStep_ApplyForcing(local_38,t,1.0,&local_54);
          N_VLinearCombination(local_54,local_40,pp_Var3,*local_38->Fe);
        }
LAB_004c13da:
        iVar2 = local_38->implicit;
        ark_mem_00 = local_50;
        goto joined_r0x004c13de;
      }
      iVar4 = local_38->implicit;
      if (iVar4 == 0) {
        iVar4 = 0;
      }
      else {
        bVar1 = true;
LAB_004c130b:
        if ((!bVar1) || (1e-10 < ABS(local_38->Bi->c[(long)local_38->stages + -1] + -1.0))) {
          if (iVar2 != 0) goto LAB_004c1347;
          goto LAB_004c13da;
        }
      }
      if (iVar2 != 0) {
        N_VScale(1.0,local_38->Fe[(long)local_38->stages + -1],*local_38->Fe);
        iVar4 = local_38->implicit;
      }
      if (iVar4 != 0) {
        N_VScale(1.0,local_38->Fi[(long)local_38->stages + -1],*local_38->Fi);
      }
    }
    else {
      if (mode != 0) {
        msgfmt = "Unknown full RHS mode";
        iVar2 = -8;
        iVar4 = -8;
        goto LAB_004c15a0;
      }
      if (local_38->explicit != 0) {
        iVar2 = (*local_38->fe)(t,y,*local_38->Fe,local_50->user_data);
        pp_Var3 = local_48;
        local_38->nfe = local_38->nfe + 1;
        if (iVar2 != 0) goto LAB_004c140a;
        if (local_38->expforcing != 0) {
          *c = 1.0;
          *local_48 = *local_38->Fe;
          local_54 = 1;
          arkStep_ApplyForcing(local_38,t,1.0,&local_54);
          N_VLinearCombination(local_54,c,pp_Var3,*local_38->Fe);
        }
      }
      iVar2 = local_38->implicit;
      ark_mem_00 = local_50;
joined_r0x004c13de:
      local_50 = ark_mem_00;
      if (iVar2 != 0) {
        iVar2 = (*local_38->fi)(t,y,*local_38->Fi,ark_mem_00->user_data);
        pp_Var3 = local_48;
        local_38->nfi = local_38->nfi + 1;
        if (iVar2 != 0) {
LAB_004c140a:
          arkProcessError(ark_mem_00,-8,"ARKode::ARKStep","arkStep_FullRHS",
                          "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                          ,t);
          return -8;
        }
        if (local_38->impforcing != 0) {
          *c = 1.0;
          *local_48 = *local_38->Fi;
          local_54 = 1;
          arkStep_ApplyForcing(local_38,t,1.0,&local_54);
          N_VLinearCombination(local_54,c,pp_Var3,*local_38->Fi);
        }
      }
    }
    if (local_38->explicit == 0) {
      if (local_38->implicit == 0) goto LAB_004c152b;
      pp_Var3 = local_38->Fi;
LAB_004c152f:
      p_Var5 = *pp_Var3;
      goto LAB_004c1532;
    }
    if (local_38->implicit == 0) {
LAB_004c152b:
      pp_Var3 = local_38->Fe;
      goto LAB_004c152f;
    }
    p_Var5 = *local_38->Fi;
    y_00 = *local_38->Fe;
LAB_004c150b:
    N_VLinearSum(1.0,p_Var5,1.0,y_00,f);
  }
  if (local_38->mass_type == 0) {
    return 0;
  }
  iVar2 = (*local_38->msolve)(local_50,f,local_38->nlscoef / local_50->h);
  if (iVar2 == 0) {
    return 0;
  }
  msgfmt = "Mass matrix solver failure";
  iVar2 = -0x10;
  iVar4 = -0x10;
LAB_004c15a0:
  arkProcessError(local_50,iVar4,"ARKode::ARKStep","arkStep_FullRHS",msgfmt);
  return iVar2;
}

Assistant:

int arkStep_FullRHS(void* arkode_mem, realtype t, N_Vector y, N_Vector f,
                    int mode)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int nvec, retval;
  booleantype recomputeRHS;
  realtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_FullRHS",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* local shortcuts for use with fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* setup mass-matrix if required (use output f as a temporary) */
  if ((step_mem->mass_type == MASS_TIMEDEP) && (step_mem->msetup != NULL)) {
    retval = step_mem->msetup((void *) ark_mem, t, f,
                              ark_mem->tempv2, ark_mem->tempv3);
    if (retval != ARK_SUCCESS)  return(ARK_MASSSETUP_FAIL);
  }

  /* perform RHS functions contingent on 'mode' argument */
  switch(mode) {

  /* ARK_FULLRHS_START: called at the beginning of a simulation
     Store the vectors fe(t,y) and fi(t,y) in Fe[0] and Fi[0] for
     possible reuse in the first stage of the subsequent time step */
  case ARK_FULLRHS_START:

    /* call fe if the problem has an explicit component */
    if (step_mem->explicit) {
      retval = step_mem->fe(t, y, step_mem->Fe[0], ark_mem->user_data);
      step_mem->nfe++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ARKStep",
                        "arkStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
      /* apply external polynomial forcing */
      if (step_mem->expforcing) {
        cvals[0] = ONE;
        Xvecs[0] = step_mem->Fe[0];
        nvec     = 1;
        arkStep_ApplyForcing(step_mem, t, ONE, &nvec);
        N_VLinearCombination(nvec, cvals, Xvecs, step_mem->Fe[0]);
      }
    }

    /* call fi if the problem has an implicit component */
    if (step_mem->implicit) {
      retval = step_mem->fi(t, y, step_mem->Fi[0], ark_mem->user_data);
      step_mem->nfi++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ARKStep",
                        "arkStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
      /* apply external polynomial forcing */
      if (step_mem->impforcing) {
        cvals[0] = ONE;
        Xvecs[0] = step_mem->Fi[0];
        nvec     = 1;
        arkStep_ApplyForcing(step_mem, t, ONE, &nvec);
        N_VLinearCombination(nvec, cvals, Xvecs, step_mem->Fi[0]);
      }
    }

    /* combine RHS vector(s) into output */
    if (step_mem->explicit && step_mem->implicit) { /* ImEx */
      N_VLinearSum(ONE, step_mem->Fi[0], ONE, step_mem->Fe[0], f);
    } else if (step_mem->implicit) {                   /* implicit */
      N_VScale(ONE, step_mem->Fi[0], f);
    } else {                                           /* explicit */
      N_VScale(ONE, step_mem->Fe[0], f);
    }

    break;


  /* ARK_FULLRHS_END: called at the end of a successful step
     If the ARK method coefficients support it, we just copy the last stage RHS
     vectors to fill f instead of calling fe() and fi().
     Copy the results to Fe[0] and Fi[0] if the ARK coefficients support it. */
  case ARK_FULLRHS_END:

    /* determine if explicit/implicit RHS functions need to be recomputed */
    recomputeRHS = SUNFALSE;
    if ( step_mem->explicit && (SUNRabs(step_mem->Be->c[step_mem->stages-1]-ONE)>TINY) )
      recomputeRHS = SUNTRUE;
    if ( step_mem->implicit && (SUNRabs(step_mem->Bi->c[step_mem->stages-1]-ONE)>TINY) )
      recomputeRHS = SUNTRUE;

    /* base RHS calls on recomputeRHS argument */
    if (recomputeRHS) {

      /* call fe if the problem has an explicit component */
      if (step_mem->explicit) {
        retval = step_mem->fe(t, y, step_mem->Fe[0], ark_mem->user_data);
        step_mem->nfe++;
        if (retval != 0) {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ARKStep",
                          "arkStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
          return(ARK_RHSFUNC_FAIL);
        }
        /* apply external polynomial forcing */
        if (step_mem->expforcing) {
          cvals[0] = ONE;
          Xvecs[0] = step_mem->Fe[0];
          nvec     = 1;
          arkStep_ApplyForcing(step_mem, t, ONE, &nvec);
          N_VLinearCombination(nvec, cvals, Xvecs, step_mem->Fe[0]);
        }
      }

      /* call fi if the problem has an implicit component */
      if (step_mem->implicit) {
        retval = step_mem->fi(t, y, step_mem->Fi[0], ark_mem->user_data);
        step_mem->nfi++;
        if (retval != 0) {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ARKStep",
                          "arkStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
          return(ARK_RHSFUNC_FAIL);
        }
        /* apply external polynomial forcing */
        if (step_mem->impforcing) {
          cvals[0] = ONE;
          Xvecs[0] = step_mem->Fi[0];
          nvec     = 1;
          arkStep_ApplyForcing(step_mem, t, ONE, &nvec);
          N_VLinearCombination(nvec, cvals, Xvecs, step_mem->Fi[0]);
        }
      }
    } else {
      if (step_mem->explicit)
        N_VScale(ONE, step_mem->Fe[step_mem->stages-1], step_mem->Fe[0]);
      if (step_mem->implicit)
        N_VScale(ONE, step_mem->Fi[step_mem->stages-1], step_mem->Fi[0]);
    }

    /* combine RHS vector(s) into output */
    if (step_mem->explicit && step_mem->implicit) { /* ImEx */
      N_VLinearSum(ONE, step_mem->Fi[0], ONE, step_mem->Fe[0], f);
    } else if (step_mem->implicit) {                   /* implicit */
      N_VScale(ONE, step_mem->Fi[0], f);
    } else {                                           /* explicit */
      N_VScale(ONE, step_mem->Fe[0], f);
    }

    break;

  /* ARK_FULLRHS_OTHER: called for dense output in-between steps or for
     estimation of the initial time step size, store the intermediate
     calculations in such a way as to not interfere with the other two modes */
  case ARK_FULLRHS_OTHER:

    /* call fe if the problem has an explicit component (store in ark_tempv2) */
    if (step_mem->explicit) {
      retval = step_mem->fe(t, y, ark_mem->tempv2, ark_mem->user_data);
      step_mem->nfe++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ARKStep",
                        "arkStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
      /* apply external polynomial forcing */
      if (step_mem->expforcing) {
        cvals[0] = ONE;
        Xvecs[0] = ark_mem->tempv2;
        nvec     = 1;
        arkStep_ApplyForcing(step_mem, t, ONE, &nvec);
        N_VLinearCombination(nvec, cvals, Xvecs, ark_mem->tempv2);
      }
    }

    /* call fi if the problem has an implicit component (store in sdata) */
    if (step_mem->implicit) {
      retval = step_mem->fi(t, y, step_mem->sdata, ark_mem->user_data);
      step_mem->nfi++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ARKStep",
                        "arkStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
      /* apply external polynomial forcing */
      if (step_mem->impforcing) {
        cvals[0] = ONE;
        Xvecs[0] = step_mem->sdata;
        nvec     = 1;
        arkStep_ApplyForcing(step_mem, t, ONE, &nvec);
        N_VLinearCombination(nvec, cvals, Xvecs, step_mem->sdata);
      }
    }

    /* combine RHS vector(s) into output */
    if (step_mem->explicit && step_mem->implicit) { /* ImEx */
      N_VLinearSum(ONE, step_mem->sdata, ONE, ark_mem->tempv2, f);
    } else if (step_mem->implicit) {                   /* implicit */
      N_VScale(ONE, step_mem->sdata, f);
    } else {                                           /* explicit */
      N_VScale(ONE, ark_mem->tempv2, f);
    }

    break;

  default:
    /* return with RHS failure if unknown mode is passed */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ARKStep",
                    "arkStep_FullRHS", "Unknown full RHS mode");
    return(ARK_RHSFUNC_FAIL);
  }

  /* if M != I, then update f = M^{-1}*f */
  if (step_mem->mass_type != MASS_IDENTITY) {
    retval = step_mem->msolve((void *) ark_mem, f,
                              step_mem->nlscoef/ark_mem->h);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, "ARKode::ARKStep",
                      "arkStep_FullRHS", "Mass matrix solver failure");
      return(ARK_MASSSOLVE_FAIL);
    }
  }

  return(ARK_SUCCESS);
}